

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

void nn_pipebase_init(nn_pipebase *self,nn_pipebase_vfptr *vfptr,nn_epbase *epbase)

{
  nn_sock *owner;
  nn_ep *pnVar1;
  long lVar2;
  int iVar3;
  nn_fsm *unaff_RBX;
  nn_fsm *self_00;
  
  owner = epbase->ep->sock;
  if (owner != (nn_sock *)0x0) {
    nn_fsm_init(&self->fsm,(nn_fsm_fn)0x0,(nn_fsm_fn)0x0,0,self,&owner->fsm);
    self->vfptr = vfptr;
    self->state = '\x01';
    self->instate = '\0';
    self->outstate = '\0';
    pnVar1 = epbase->ep;
    self->sock = pnVar1->sock;
    iVar3 = (pnVar1->options).rcvprio;
    (self->options).sndprio = (pnVar1->options).sndprio;
    (self->options).rcvprio = iVar3;
    (self->options).ipv4only = (pnVar1->options).ipv4only;
    nn_fsm_event_init(&self->in);
    nn_fsm_event_init(&self->out);
    return;
  }
  nn_pipebase_init_cold_1();
  if (self->state != 1) {
    self_00 = (nn_fsm *)(ulong)self->state;
    nn_pipebase_term_cold_1();
    if (*(char *)&self_00[1].shutdown_fn == '\x01') {
      *(undefined2 *)&self_00[1].shutdown_fn = 0x402;
      *(undefined1 *)((long)&self_00[1].shutdown_fn + 2) = 1;
      iVar3 = nn_sock_add(*(nn_sock **)&self_00[1].state,(nn_pipe *)self_00);
      unaff_RBX = self_00;
      if (-1 < iVar3) {
        lVar2._0_4_ = self_00[1].state;
        lVar2._4_4_ = self_00[1].src;
        if (lVar2 == 0) {
          return;
        }
        nn_fsm_raise(self_00,(nn_fsm_event *)&self_00[1].stopped.type,0x84c4);
        return;
      }
    }
    else {
      nn_pipebase_start_cold_1();
    }
    *(undefined1 *)&unaff_RBX[1].shutdown_fn = 3;
    return;
  }
  nn_fsm_event_term(&self->out);
  nn_fsm_event_term(&self->in);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_pipebase_init (struct nn_pipebase *self,
    const struct nn_pipebase_vfptr *vfptr, struct nn_epbase *epbase)
{
    nn_assert (epbase->ep->sock);

    nn_fsm_init (&self->fsm, NULL, NULL, 0, self, &epbase->ep->sock->fsm);
    self->vfptr = vfptr;
    self->state = NN_PIPEBASE_STATE_IDLE;
    self->instate = NN_PIPEBASE_INSTATE_DEACTIVATED;
    self->outstate = NN_PIPEBASE_OUTSTATE_DEACTIVATED;
    self->sock = epbase->ep->sock;
    memcpy (&self->options, &epbase->ep->options,
        sizeof (struct nn_ep_options));
    nn_fsm_event_init (&self->in);
    nn_fsm_event_init (&self->out);
}